

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O1

void __thiscall PythonModuleClient::recv_time(PythonModuleClient *this,uint32_t time)

{
  undefined4 uVar1;
  int iVar2;
  override recv_time;
  long *local_30;
  uint32_t local_24;
  long *local_20;
  
  local_24 = time;
  uVar1 = PyGILState_Ensure();
  boost::python::converter::registration::get_class_object
            (boost::python::converter::detail::registered_base<AbstractModuleClient_const_volatile&>
             ::converters);
  boost::python::detail::wrapper_base::get_override
            ((char *)&local_30,(_typeobject *)&this->super_wrapper<AbstractModuleClient>);
  iVar2 = PyObject_IsTrue(local_30);
  if (iVar2 < 0) {
    boost::python::throw_error_already_set();
  }
  if (iVar2 == 0) {
    *local_30 = *local_30 + -1;
    if (*local_30 == 0) {
      _Py_Dealloc();
    }
  }
  else {
    boost::python::override::operator()((override *)&local_20,(uint *)&local_30);
    if ((local_20 != (long *)0x0) && (*local_20 = *local_20 + -1, *local_20 == 0)) {
      _Py_Dealloc();
    }
    *local_30 = *local_30 + -1;
    if (*local_30 == 0) {
      _Py_Dealloc();
    }
  }
  PyGILState_Release(uVar1);
  return;
}

Assistant:

void recv_time(uint32_t time){
        PyLockGIL lock;
        if(override recv_time = this->get_override("recv_time")){
            try{
                recv_time(time);
            }
            catch (const error_already_set&){
                std::cout << "Exception in recv_time in application";
                PyErr_Print();
            }
            return;
        }
        AbstractModuleClient::recv_time(time);
    }